

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ll_node * ll_append(ll_node *root,void *ptr,size_t isize)

{
  ll_node *node;
  ll_node *result;
  ll_node *new_node;
  size_t isize_local;
  void *ptr_local;
  ll_node *root_local;
  
  node = ll_create_node(ptr,isize);
  root_local = ll_append_node(root,node);
  if ((node == (ll_node *)0x0) || (root_local == (ll_node *)0x0)) {
    ll_free_node(node);
    root_local = (ll_node *)0x0;
  }
  return root_local;
}

Assistant:

struct ll_node *ll_append(struct ll_node *root, const void *ptr, size_t isize)
{
	struct ll_node *new_node = ll_create_node(ptr, isize);
	struct ll_node *result = ll_append_node(root, new_node);
	if (new_node != NULL && result != NULL) {
		return result;
	}
	ll_free_node(new_node);
	return NULL;
}